

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O1

QString * __thiscall
QTemporaryDir::filePath(QString *__return_storage_ptr__,QTemporaryDir *this,QString *fileName)

{
  QTemporaryDirPrivate *pQVar1;
  Data *pDVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArray QStack_58;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDir::isRelativePath(fileName);
  if (bVar3) {
    pQVar1 = this->d_ptr;
    if (pQVar1->success == true) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pDVar2 = (pQVar1->pathOrError).d.d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (pQVar1->pathOrError).d.ptr;
      (__return_storage_ptr__->d).size = (pQVar1->pathOrError).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((fileName->d).size != 0) {
        QString::append(__return_storage_ptr__,(QChar)0x2f);
        QString::append(__return_storage_ptr__,fileName);
      }
      goto LAB_0025ab76;
    }
  }
  else {
    local_40.context.version = 2;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.function._4_4_ = 0;
    local_40.context.category = "default";
    QString::toUtf8_helper(&QStack_58,fileName);
    if (QStack_58.d.ptr == (char *)0x0) {
      QStack_58.d.ptr = "";
    }
    QMessageLogger::warning
              (&local_40,"QTemporaryDir::filePath: Absolute paths are not allowed: %s",
               QStack_58.d.ptr);
    filePath();
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0025ab76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTemporaryDir::filePath(const QString &fileName) const
{
    if (QDir::isAbsolutePath(fileName)) {
        qWarning("QTemporaryDir::filePath: Absolute paths are not allowed: %s", qUtf8Printable(fileName));
        return QString();
    }

    if (!d_ptr->success)
        return QString();

    QString ret = d_ptr->pathOrError;
    if (!fileName.isEmpty()) {
        ret += u'/';
        ret += fileName;
    }
    return ret;
}